

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O1

void PutBits(INT32 Number,UINT32 Value)

{
  UINT8 *pUVar1;
  byte *pbVar2;
  byte *pbVar3;
  UINT32 UVar4;
  
  UVar4 = mSubBitBuf;
  pUVar1 = mDstUpperLimit;
  if (mBitCount <= Number) {
    mSubBitBuf = 0;
    pbVar2 = mDst;
    do {
      Number = Number - mBitCount;
      pbVar3 = pbVar2;
      if (pbVar2 < pUVar1) {
        pbVar3 = pbVar2 + 1;
        mDst = pbVar3;
        *pbVar2 = (byte)UVar4 | (byte)(Value >> ((byte)Number & 0x1f));
      }
      mCompSize = mCompSize + 1;
      UVar4 = 0;
      mBitCount = 8;
      pbVar2 = pbVar3;
    } while (7 < Number);
  }
  mBitCount = mBitCount - Number;
  mSubBitBuf = mSubBitBuf | Value << ((byte)mBitCount & 0x1f);
  return;
}

Assistant:

STATIC 
VOID 
PutBits (
  IN INT32 n, 
  IN UINT32 x
  )
/*++

Routine Description:

  Outputs rightmost n bits of x

Argments:

  n   - the rightmost n bits of the data is used
  x   - the data 

Returns: (VOID)

--*/
{
  UINT8 Temp;  
  
  if (n < mBitCount) {
    mSubBitBuf |= x << (mBitCount -= n);
  } else {
      
    Temp = (UINT8)(mSubBitBuf | (x >> (n -= mBitCount)));
    if (mDst < mDstUpperLimit) {
      *mDst++ = Temp;
    }
    mCompSize++;

    if (n < UINT8_BIT) {
      mSubBitBuf = x << (mBitCount = UINT8_BIT - n);
    } else {
        
      Temp = (UINT8)(x >> (n - UINT8_BIT));
      if (mDst < mDstUpperLimit) {
        *mDst++ = Temp;
      }
      mCompSize++;
      
      mSubBitBuf = x << (mBitCount = 2 * UINT8_BIT - n);
    }
  }
}